

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

SoftmaxLayerParams * __thiscall
CoreML::Specification::SoftmaxLayerParams::New(SoftmaxLayerParams *this,Arena *arena)

{
  SoftmaxLayerParams *this_00;
  
  this_00 = (SoftmaxLayerParams *)operator_new(0x18);
  SoftmaxLayerParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::SoftmaxLayerParams>(arena,this_00);
  }
  return this_00;
}

Assistant:

SoftmaxLayerParams* SoftmaxLayerParams::New(::google::protobuf::Arena* arena) const {
  SoftmaxLayerParams* n = new SoftmaxLayerParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}